

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void CVmObjString::add_to_str(vm_val_t *result,vm_val_t *self,vm_val_t *val)

{
  undefined4 uVar1;
  int iVar2;
  vm_obj_id_t obj_00;
  size_t sVar3;
  CVmObjString *this;
  char *pcVar4;
  CVmObject *ofs;
  int *in_RDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t new_obj2;
  CVmObjString *objptr;
  size_t len2;
  size_t len1;
  vm_obj_id_t obj;
  char buf [128];
  char *strval2;
  char *strval1;
  vm_val_t *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined8 in_stack_ffffffffffffff38;
  vm_val_t *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  vm_val_t *in_stack_ffffffffffffff58;
  
  vm_val_t::get_as_string(in_stack_ffffffffffffff28);
  cvt_to_str(in_stack_ffffffffffffff58,
             (char *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),(int)in_stack_ffffffffffffff38);
  sVar3 = vmb_get_len((char *)0x33e58c);
  this = (CVmObjString *)vmb_get_len((char *)0x33e59e);
  if ((this == (CVmObjString *)0x0) || (*in_RDX == 1)) {
    uVar1 = *(undefined4 *)&in_RSI->field_0x4;
    in_RDI->typ = in_RSI->typ;
    *(undefined4 *)&in_RDI->field_0x4 = uVar1;
    in_RDI->val = in_RSI->val;
  }
  else if ((sVar3 == 0) &&
          (pcVar4 = vm_val_t::get_as_string(in_stack_ffffffffffffff28), pcVar4 != (char *)0x0)) {
    iVar2 = in_RDX[1];
    in_RDI->typ = in_RDX[0];
    *(int *)&in_RDI->field_0x4 = iVar2;
    in_RDI->val = *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 2);
  }
  else {
    CVmStack::push(in_RSI);
    CVmStack::push((vm_val_t *)&stack0xffffffffffffff28);
    obj_00 = create(in_stack_ffffffffffffff34,(size_t)in_stack_ffffffffffffff28);
    ofs = vm_objp(0);
    copy_into_str(this,(size_t)ofs,
                  (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (size_t)in_stack_ffffffffffffff28);
    copy_into_str(this,(size_t)ofs,
                  (char *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                  (size_t)in_stack_ffffffffffffff28);
    CVmStack::discard(2);
    vm_val_t::set_obj(in_RDI,obj_00);
  }
  return;
}

Assistant:

void CVmObjString::add_to_str(VMG_ vm_val_t *result,
                              const vm_val_t *self, const vm_val_t *val)
{
    const char *strval1, *strval2;
    char buf[128];
    vm_obj_id_t obj;
    size_t len1, len2;
    CVmObjString *objptr;
    vm_val_t new_obj2;

    /* 
     *   Get the string buffer pointers.  The left value is already a string,
     *   or we wouldn't be here.  The right value can be anything, though, so
     *   we need to apply an implicit string conversion if it's another type.
     */
    strval1 = self->get_as_string(vmg0_);
    strval2 = cvt_to_str(vmg_ &new_obj2, buf, sizeof(buf), val, 10, 0);

    /* get the lengths of the two strings */
    len1 = vmb_get_len(strval1);
    len2 = vmb_get_len(strval2);

    /*
     *   If the right-hand value is zero length, or it's nil, simply return
     *   the left-hand value.  If the left-hand value is zero length AND the
     *   right-hand value is already a string (constant or object), return
     *   the right-hand value unchanged.  Otherwise, we actually need to
     *   build a whole new string with the concatenated texts.  
     */
    if (len2 == 0 || val->typ == VM_NIL)
    {
        /* we're appending nothing to the string; just return 'self' */
        *result = *self;
    }
    else if (len1 == 0 && val->get_as_string(vmg0_) != 0)
    {
        /* 
         *   we're appending the right value to an empty string, AND the
         *   right value is already a string itself, so we can simply return
         *   the right value unchanged 
         */
        *result = *val;
    }
    else
    {
        /* 
         *   push the new string (if any) and self, to protect the two
         *   strings from garbage collection 
         */
        G_stk->push(self);
        G_stk->push(&new_obj2);

        /* create a new string object to hold the result */
        obj = create(vmg_ FALSE, len1 + len2);
        objptr = (CVmObjString *)vm_objp(vmg_ obj);

        /* copy the two strings into the new object's string buffer */
        objptr->copy_into_str(0, strval1 + VMB_LEN, len1);
        objptr->copy_into_str(len1, strval2 + VMB_LEN, len2);

        /* we're done with the garbage collection protection */
        G_stk->discard(2);

        /* return the new object in the result */
        result->set_obj(obj);
    }
}